

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O3

lzma_outbuf * lzma_outq_get_buf(lzma_outq *outq)

{
  lzma_outbuf *plVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = outq->bufs_allocated;
  uVar3 = outq->bufs_used;
  if (uVar3 < uVar2) {
    uVar4 = outq->bufs_pos;
    plVar1 = outq->bufs + uVar4;
    plVar1->buf = outq->bufs_mem + (ulong)uVar4 * outq->buf_size_max;
    plVar1->size = 0;
    plVar1->finished = false;
    uVar5 = 0;
    if (uVar4 + 1 != uVar2) {
      uVar5 = uVar4 + 1;
    }
    outq->bufs_pos = uVar5;
    outq->bufs_used = uVar3 + 1;
    return plVar1;
  }
  __assert_fail("outq->bufs_used < outq->bufs_allocated",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/outqueue.c"
                ,0x75,"lzma_outbuf *lzma_outq_get_buf(lzma_outq *)");
}

Assistant:

extern lzma_outbuf *
lzma_outq_get_buf(lzma_outq *outq)
{
	// Caller must have checked it with lzma_outq_has_buf().
	assert(outq->bufs_used < outq->bufs_allocated);

	// Initialize the new buffer.
	lzma_outbuf *buf = &outq->bufs[outq->bufs_pos];
	buf->buf = outq->bufs_mem + outq->bufs_pos * outq->buf_size_max;
	buf->size = 0;
	buf->finished = false;

	// Update the queue state.
	if (++outq->bufs_pos == outq->bufs_allocated)
		outq->bufs_pos = 0;

	++outq->bufs_used;

	return buf;
}